

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O2

void __thiscall
CMapLayers::LoadEnvPoints
          (CMapLayers *this,CLayers *pLayers,
          array<CEnvPoint,_allocator_default<CEnvPoint>_> *lEnvPoints)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  int *piVar4;
  long lVar5;
  int iVar6;
  int i;
  int iVar7;
  long lVar8;
  long in_FS_OFFSET;
  int Num;
  int Start;
  int Start_1;
  undefined4 auStack_88 [4];
  undefined4 auStack_78 [4];
  undefined4 auStack_68 [4];
  undefined4 auStack_58 [4];
  undefined4 auStack_48 [4];
  long local_38;
  long lVar3;
  undefined4 extraout_var_00;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  array<CEnvPoint,_allocator_default<CEnvPoint>_>::clear(lEnvPoints);
  (*(pLayers->m_pMap->super_IInterface)._vptr_IInterface[6])(pLayers->m_pMap,6,&Start_1,&Start);
  if (Start != 0) {
    iVar7 = 0;
    iVar2 = (*(pLayers->m_pMap->super_IInterface)._vptr_IInterface[5])
                      (pLayers->m_pMap,_Start_1 & 0xffffffff,0,0);
    lVar3 = CONCAT44(extraout_var,iVar2);
    (*(pLayers->m_pMap->super_IInterface)._vptr_IInterface[6])(pLayers->m_pMap,3,&Start,&Num);
    if (Num != 0) {
      for (; iVar7 < Num; iVar7 = iVar7 + 1) {
        iVar2 = (*(pLayers->m_pMap->super_IInterface)._vptr_IInterface[5])
                          (pLayers->m_pMap,(ulong)(uint)(Start + iVar7),0,0);
        piVar4 = (int *)CONCAT44(extraout_var_00,iVar2);
        if (*piVar4 < 3) {
          lVar8 = lVar3 + 8;
          for (iVar2 = 0; iVar2 < piVar4[3]; iVar2 = iVar2 + 1) {
            iVar1 = piVar4[2];
            _Start_1 = *(ulong *)(lVar3 + ((long)iVar2 + (long)iVar1) * 0x18);
            lVar5 = 0;
            while( true ) {
              iVar6 = piVar4[1];
              if (3 < iVar6) {
                iVar6 = 4;
              }
              if (iVar6 <= lVar5) break;
              auStack_88[lVar5] = *(undefined4 *)((long)iVar1 * 0x18 + lVar8 + lVar5 * 4);
              auStack_78[lVar5] = 0;
              auStack_68[lVar5] = 0;
              auStack_58[lVar5] = 0;
              auStack_48[lVar5] = 0;
              lVar5 = lVar5 + 1;
            }
            array<CEnvPoint,_allocator_default<CEnvPoint>_>::add(lEnvPoints,(CEnvPoint *)&Start_1);
            lVar8 = lVar8 + 0x18;
          }
        }
        else {
          for (lVar8 = 0; (int)lVar8 < piVar4[3]; lVar8 = lVar8 + 1) {
            array<CEnvPoint,_allocator_default<CEnvPoint>_>::add
                      (lEnvPoints,(CEnvPoint *)((piVar4[2] + lVar8) * 0x58 + lVar3));
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CMapLayers::LoadEnvPoints(const CLayers *pLayers, array<CEnvPoint>& lEnvPoints)
{
	lEnvPoints.clear();

	// get envelope points
	CEnvPoint *pPoints = 0x0;
	{
		int Start, Num;
		pLayers->Map()->GetType(MAPITEMTYPE_ENVPOINTS, &Start, &Num);

		if(!Num)
			return;

		pPoints = (CEnvPoint *)pLayers->Map()->GetItem(Start, 0, 0);
	}

	// get envelopes
	int Start, Num;
	pLayers->Map()->GetType(MAPITEMTYPE_ENVELOPE, &Start, &Num);
	if(!Num)
		return;


	for(int env = 0; env < Num; env++)
	{
		CMapItemEnvelope *pItem = (CMapItemEnvelope *)pLayers->Map()->GetItem(Start+env, 0, 0);

		if(pItem->m_Version >= 3)
		{
			for(int i = 0; i < pItem->m_NumPoints; i++)
				lEnvPoints.add(pPoints[i + pItem->m_StartPoint]);
		}
		else
		{
			// backwards compatibility
			for(int i = 0; i < pItem->m_NumPoints; i++)
			{
				// convert CEnvPoint_v1 -> CEnvPoint
				CEnvPoint_v1 *pEnvPoint_v1 = &((CEnvPoint_v1 *)pPoints)[i + pItem->m_StartPoint];
				CEnvPoint p;

				p.m_Time = pEnvPoint_v1->m_Time;
				p.m_Curvetype = pEnvPoint_v1->m_Curvetype;

				for(int c = 0; c < minimum(pItem->m_Channels, 4); c++)
				{
					p.m_aValues[c] = pEnvPoint_v1->m_aValues[c];
					p.m_aInTangentdx[c] = 0;
					p.m_aInTangentdy[c] = 0;
					p.m_aOutTangentdx[c] = 0;
					p.m_aOutTangentdy[c] = 0;
				}

				lEnvPoints.add(p);
			}
		}
	}
}